

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SectHdrsWrapper.cpp
# Opt level: O0

QString * SectionHdrWrapper::getSecHdrAccessRightsDesc
                    (QString *__return_storage_ptr__,DWORD characteristics)

{
  undefined4 local_18;
  DWORD local_14;
  char rights [4];
  DWORD characteristics_local;
  
  local_18 = 0x2d2d2d;
  if ((characteristics & 0x40000000) != 0) {
    local_18 = 0x2d2d72;
  }
  if ((characteristics & 0x80000000) != 0) {
    local_18._0_2_ = CONCAT11(0x77,(char)local_18);
  }
  if ((characteristics & 0x20000000) != 0) {
    local_18 = (uint)CONCAT12(0x78,(undefined2)local_18);
  }
  local_14 = characteristics;
  _rights = __return_storage_ptr__;
  QString::QString(__return_storage_ptr__,(char *)&local_18);
  return __return_storage_ptr__;
}

Assistant:

QString SectionHdrWrapper::getSecHdrAccessRightsDesc(DWORD characteristics)
{
    char rights[] = "---";

    if (characteristics & SCN_MEM_READ)
        rights[0] = 'r';
    if (characteristics & SCN_MEM_WRITE)
        rights[1] = 'w';
    if (characteristics & SCN_MEM_EXECUTE)
        rights[2] = 'x';
    return rights;
}